

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O0

void __thiscall ipx::Maxvolume::Reset(Maxvolume *this)

{
  Maxvolume *this_local;
  
  this->updates_ = 0;
  this->skipped_ = 0;
  this->passes_ = 0;
  this->slices_ = 0;
  this->volinc_ = 0.0;
  this->time_ = 0.0;
  this->tblnnz_ = 0;
  this->tblmax_ = 0.0;
  this->frobnorm_squared_ = 0.0;
  return;
}

Assistant:

void Maxvolume::Reset() {
    updates_ = 0;
    skipped_ = 0;
    passes_ = 0;
    slices_ = 0;
    volinc_ = 0.0;;
    time_ = 0.0;
    tblnnz_ = 0;
    tblmax_ = 0.0;
    frobnorm_squared_ = 0.0;
}